

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_2760b7::validatePixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  Array2D<Imath_3_2::half> *pAVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  half *phVar7;
  half rgbaValue [4];
  half local_70;
  half local_6e;
  half local_6c;
  Array2D<Imath_3_2::half> *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  local_48 = (long)*pImageHeight;
  if (0 < local_48) {
    local_58 = (ulong)(uint)*pImageWidth;
    phVar7 = pPixels->_data;
    local_38 = (ulong)(uint)pNbChannels * 2;
    local_40 = (long)pNbChannels * 2;
    local_50 = pPixels->_sizeY * 2;
    local_60 = 0;
    lVar5 = 0;
    local_68 = pPixels;
    do {
      if (0 < (int)local_58) {
        lVar4 = 0;
        uVar6 = 0;
        do {
          generatePixel((int)lVar5,(int)uVar6,&local_70,pIsLeft);
          iVar2 = bcmp((void *)((long)&phVar7->_h + lVar4),&local_70,local_38);
          if (iVar2 != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"ERROR at pixel [");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar5);
            poVar3 = std::operator<<(poVar3,";");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar6);
            poVar3 = std::operator<<(poVar3,"]");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&std::cout,"\tExpected [");
            poVar3 = (ostream *)::operator<<(poVar3,local_70);
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = (ostream *)::operator<<(poVar3,local_6e);
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = (ostream *)::operator<<(poVar3,local_6c);
            poVar3 = std::operator<<(poVar3,"] ");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&std::cout,"\tReceived [");
            lVar5 = local_60;
            pAVar1 = local_68;
            poVar3 = (ostream *)
                     ::operator<<(poVar3,(half)*(uint16_t *)
                                                ((long)&local_68->_data->_h +
                                                lVar4 + local_68->_sizeY * local_60));
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = (ostream *)
                     ::operator<<(poVar3,(half)*(uint16_t *)
                                                ((long)&pAVar1->_data[1]._h +
                                                pAVar1->_sizeY * lVar5 + lVar4));
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = (ostream *)
                     ::operator<<(poVar3,(half)*(uint16_t *)
                                                ((long)&pAVar1->_data[2]._h +
                                                lVar5 * pAVar1->_sizeY + lVar4));
            poVar3 = std::operator<<(poVar3,"]");
            std::endl<char,std::char_traits<char>>(poVar3);
            __assert_fail("retVal == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                          ,0xb8,
                          "void (anonymous namespace)::validatePixels(const int &, const int &, Array2D<half> &, int, bool)"
                         );
          }
          uVar6 = uVar6 + 1;
          lVar4 = lVar4 + local_40;
        } while (local_58 != uVar6);
      }
      lVar5 = lVar5 + 1;
      local_60 = local_60 + 2;
      phVar7 = (half *)((long)&phVar7->_h + local_50);
    } while (lVar5 != local_48);
  }
  return;
}

Assistant:

void
validatePixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            int  retVal = -1;
            half rgbaValue[4];
            generatePixel (i, j, &rgbaValue[0], pIsLeft);

            retVal = memcmp (
                (void*) &pPixels[i][j * pNbChannels],
                (void*) &rgbaValue[0],
                pNbChannels * sizeof (half));

            if (retVal != 0)
            {
                cout << "ERROR at pixel [" << i << ";" << j << "]" << endl;
                cout << "\tExpected [" << rgbaValue[0] << ", " << rgbaValue[1]
                     << ", " << rgbaValue[2] << "] " << endl;

                cout << "\tReceived [" << pPixels[i][j * pNbChannels] << ", "
                     << pPixels[i][j * pNbChannels + 1] << ", "
                     << pPixels[i][j * pNbChannels + 2] << "]" << endl;
                assert (retVal == 0);
            }
        }
    }
}